

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus ZydisNodeHandlerEvexB(ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZyanU16 *index_local;
  ZydisDecodedInstruction *instruction_local;
  
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1010,
                  "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if (index == (ZyanU16 *)0x0) {
    __assert_fail("index",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1011,
                  "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
    __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1013,
                  "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)");
  }
  if ((instruction->attributes & 0x20) != 0) {
    *index = (ushort)(instruction->raw).field_3.evex.b;
    return 0x100000;
  }
  __assert_fail("instruction->attributes & (1ULL << 5)",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0x1014,
                "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)");
}

Assistant:

static ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    ZYAN_ASSERT(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX);
    ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_EVEX);
    *index = instruction->raw.evex.b;
    return ZYAN_STATUS_SUCCESS;
}